

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

double __thiscall pstore::logger::log(logger *this,double __x)

{
  char *in_RDX;
  uint in_ESI;
  double dVar1;
  allocator local_39;
  string local_38 [32];
  
  std::__cxx11::string::string(local_38,in_RDX,&local_39);
  (*this->_vptr_logger[2])(this,(ulong)in_ESI,local_38);
  dVar1 = (double)std::__cxx11::string::~string(local_38);
  return dVar1;
}

Assistant:

void logger::log (priority const p, gsl::czstring const message) {
            this->log (p, std::string{message});
        }